

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.cpp
# Opt level: O0

void __thiscall NJamSpell::TBloomFilter::TBloomFilter(TBloomFilter *this)

{
  Impl *this_00;
  TBloomFilter *this_local;
  
  std::unique_ptr<NJamSpell::TBloomFilter::Impl,std::default_delete<NJamSpell::TBloomFilter::Impl>>
  ::unique_ptr<std::default_delete<NJamSpell::TBloomFilter::Impl>,void>
            ((unique_ptr<NJamSpell::TBloomFilter::Impl,std::default_delete<NJamSpell::TBloomFilter::Impl>>
              *)this);
  this_00 = (Impl *)operator_new(0x68);
  Impl::Impl(this_00);
  std::
  unique_ptr<NJamSpell::TBloomFilter::Impl,_std::default_delete<NJamSpell::TBloomFilter::Impl>_>::
  reset(&this->BloomFilter,this_00);
  return;
}

Assistant:

TBloomFilter::TBloomFilter() {
    BloomFilter.reset(new TBloomFilter::Impl());
}